

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionEvaluator.cpp
# Opt level: O3

void __thiscall OpenMD::SelectionEvaluator::SelectionEvaluator(SelectionEvaluator *this,SimInfo *si)

{
  vector<int,_std::allocator<int>_> *this_00;
  _Rb_tree_header *p_Var1;
  SimInfo *pSVar2;
  int *piVar3;
  iterator iVar4;
  int local_5c [3];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_40;
  NameFinder *local_38;
  
  (this->compiler).filename._M_dataplus._M_p = (pointer)&(this->compiler).filename.field_2;
  (this->compiler).filename._M_string_length = 0;
  (this->compiler).filename.field_2._M_local_buf[0] = '\0';
  (this->compiler).script._M_dataplus._M_p = (pointer)&(this->compiler).script.field_2;
  (this->compiler).script._M_string_length = 0;
  (this->compiler).script.field_2._M_local_buf[0] = '\0';
  (this->compiler).lineNumbers.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->compiler).lineNumbers.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->compiler).lineNumbers.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->compiler).lineIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->compiler).lineIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->compiler).lineIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->compiler).aatokenCompiled.
  super__Vector_base<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>,_std::allocator<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->compiler).aatokenCompiled.
  super__Vector_base<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>,_std::allocator<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->compiler).aatokenCompiled.
  super__Vector_base<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>,_std::allocator<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->compiler).errorMessage._M_dataplus._M_p = (pointer)&(this->compiler).errorMessage.field_2;
  (this->compiler).errorMessage._M_string_length = 0;
  (this->compiler).errorMessage.field_2._M_local_buf[0] = '\0';
  (this->compiler).errorLine._M_dataplus._M_p = (pointer)&(this->compiler).errorLine.field_2;
  (this->compiler).errorLine._M_string_length = 0;
  (this->compiler).errorLine.field_2._M_local_buf[0] = '\0';
  (this->compiler).atokenCommand.super__Vector_base<OpenMD::Token,_std::allocator<OpenMD::Token>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->compiler).atokenCommand.super__Vector_base<OpenMD::Token,_std::allocator<OpenMD::Token>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->compiler).atokenCommand.super__Vector_base<OpenMD::Token,_std::allocator<OpenMD::Token>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->compiler).atokenInfix.super__Vector_base<OpenMD::Token,_std::allocator<OpenMD::Token>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->compiler).atokenInfix.super__Vector_base<OpenMD::Token,_std::allocator<OpenMD::Token>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->compiler).ltokenPostfix.super__Vector_base<OpenMD::Token,_std::allocator<OpenMD::Token>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->compiler).atokenInfix.super__Vector_base<OpenMD::Token,_std::allocator<OpenMD::Token>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->compiler).ltokenPostfix.super__Vector_base<OpenMD::Token,_std::allocator<OpenMD::Token>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->compiler).ltokenPostfix.super__Vector_base<OpenMD::Token,_std::allocator<OpenMD::Token>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_40 = &(this->filename).field_2;
  (this->filename)._M_dataplus._M_p = (pointer)local_40;
  (this->filename)._M_string_length = 0;
  (this->filename).field_2._M_local_buf[0] = '\0';
  local_48 = &(this->script).field_2;
  (this->script)._M_dataplus._M_p = (pointer)local_48;
  (this->script)._M_string_length = 0;
  (this->script).field_2._M_local_buf[0] = '\0';
  this->error = false;
  local_50 = &(this->errorMessage).field_2;
  (this->linenumbers).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->linenumbers).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->linenumbers).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->lineIndices).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->lineIndices).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->lineIndices).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->aatoken).
  super__Vector_base<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>,_std::allocator<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->aatoken).
  super__Vector_base<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>,_std::allocator<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->aatoken).
  super__Vector_base<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>,_std::allocator<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->errorMessage)._M_dataplus._M_p = (pointer)local_50;
  (this->errorMessage)._M_string_length = 0;
  (this->errorMessage).field_2._M_local_buf[0] = '\0';
  (this->statement).super__Vector_base<OpenMD::Token,_std::allocator<OpenMD::Token>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->statement).super__Vector_base<OpenMD::Token,_std::allocator<OpenMD::Token>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->statement).super__Vector_base<OpenMD::Token,_std::allocator<OpenMD::Token>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  this->info = si;
  NameFinder::NameFinder(&this->nameFinder,si);
  local_38 = &this->nameFinder;
  DistanceFinder::DistanceFinder(&this->distanceFinder,this->info);
  HullFinder::HullFinder(&this->hullFinder,this->info);
  AlphaHullFinder::AlphaHullFinder(&this->alphaHullFinder,this->info);
  IndexFinder::IndexFinder(&this->indexFinder,this->info);
  this_00 = &this->nObjects;
  (this->nObjects).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->nObjects).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->nObjects).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  p_Var1 = &(this->variables)._M_t._M_impl.super__Rb_tree_header;
  (this->variables)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->variables)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->variables)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->variables)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  this->hasVolume_ = false;
  *(undefined4 *)((long)&(this->variables)._M_t._M_impl.super__Rb_tree_header._M_node_count + 7) = 0
  ;
  (this->variables)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_5c[0] = this->info->nGlobalRigidBodies_ + this->info->nGlobalAtoms_;
  std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(this_00,(iterator)0x0,local_5c);
  pSVar2 = this->info;
  local_5c[0] = pSVar2->nGlobalBonds_;
  iVar4._M_current =
       (this->nObjects).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  piVar3 = (this->nObjects).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  if (iVar4._M_current == piVar3) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(this_00,iVar4,local_5c);
    pSVar2 = this->info;
    iVar4._M_current =
         (this->nObjects).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    piVar3 = (this->nObjects).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar4._M_current = local_5c[0];
    iVar4._M_current = iVar4._M_current + 1;
    (this->nObjects).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = iVar4._M_current;
  }
  local_5c[0] = pSVar2->nGlobalBends_;
  if (iVar4._M_current == piVar3) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(this_00,iVar4,local_5c);
    pSVar2 = this->info;
    iVar4._M_current =
         (this->nObjects).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    piVar3 = (this->nObjects).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar4._M_current = local_5c[0];
    iVar4._M_current = iVar4._M_current + 1;
    (this->nObjects).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = iVar4._M_current;
  }
  local_5c[0] = pSVar2->nGlobalTorsions_;
  if (iVar4._M_current == piVar3) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(this_00,iVar4,local_5c);
    pSVar2 = this->info;
    iVar4._M_current =
         (this->nObjects).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    piVar3 = (this->nObjects).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar4._M_current = local_5c[0];
    iVar4._M_current = iVar4._M_current + 1;
    (this->nObjects).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = iVar4._M_current;
  }
  local_5c[0] = pSVar2->nGlobalInversions_;
  if (iVar4._M_current == piVar3) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(this_00,iVar4,local_5c);
    pSVar2 = this->info;
    iVar4._M_current =
         (this->nObjects).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    piVar3 = (this->nObjects).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar4._M_current = local_5c[0];
    iVar4._M_current = iVar4._M_current + 1;
    (this->nObjects).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = iVar4._M_current;
  }
  local_5c[0] = pSVar2->nGlobalMols_;
  if (iVar4._M_current == piVar3) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(this_00,iVar4,local_5c);
  }
  else {
    *iVar4._M_current = local_5c[0];
    (this->nObjects).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = iVar4._M_current + 1;
  }
  return;
}

Assistant:

SelectionEvaluator::SelectionEvaluator(SimInfo* si) :
      info(si), nameFinder(info), distanceFinder(info), hullFinder(info),
      alphaHullFinder(info), indexFinder(info), isLoaded_(false),
      hasSurfaceArea_(false), hasVolume_(false) {
    nObjects.push_back(info->getNGlobalAtoms() + info->getNGlobalRigidBodies());
    nObjects.push_back(info->getNGlobalBonds());
    nObjects.push_back(info->getNGlobalBends());
    nObjects.push_back(info->getNGlobalTorsions());
    nObjects.push_back(info->getNGlobalInversions());
    nObjects.push_back(info->getNGlobalMolecules());
  }